

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

void __thiscall miniscript_tests::fixed_tests::test_method(fixed_tests *this)

{
  long lVar1;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  bool bVar2;
  const_iterator piVar3;
  uint *puVar4;
  Node<CPubKey> *pNVar5;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb348;
  undefined4 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *this_00;
  int *in_stack_ffffffffffffb350;
  lazy_ostream *prev;
  optional<unsigned_int> *in_stack_ffffffffffffb358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  assertion_result *this_01;
  Node<CPubKey> *pNVar10;
  Node<CPubKey> *this_02;
  Node<CPubKey> *in_stack_ffffffffffffb368;
  const_string *in_stack_ffffffffffffb370;
  string *in_stack_ffffffffffffb378;
  string *in_stack_ffffffffffffb380;
  string *in_stack_ffffffffffffb388;
  allocator<char> *__a;
  const_iterator in_stack_ffffffffffffb390;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb398;
  string *in_stack_ffffffffffffb3a0;
  string *hexscript;
  string *in_stack_ffffffffffffb3a8;
  string *ms;
  MiniScriptTest *in_stack_ffffffffffffb3b0;
  MiniScriptTest *this_03;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffb3c0;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffb3c8;
  _Optional_payload_base<unsigned_int> in_stack_ffffffffffffb3d0;
  size_t in_stack_ffffffffffffb3d8;
  int iVar11;
  undefined8 in_stack_ffffffffffffb3f0;
  TestData *in_stack_ffffffffffffb538;
  Node<CPubKey> *insane_sub;
  int i_2;
  int count;
  int i_1;
  int pk_count;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> *__range1;
  size_t i;
  fixed_tests *this_local;
  allocator<char> local_3eba;
  allocator<char> local_3eb9;
  allocator<char> local_3eb8;
  allocator<char> local_3eb7;
  allocator<char> local_3eb6;
  undefined1 local_3eb5;
  undefined1 local_3eb4;
  undefined1 local_3eb3;
  undefined1 local_3eb2 [2];
  allocator<char> local_3eb0;
  allocator<char> local_3eaf;
  allocator<char> local_3eae;
  allocator<char> local_3ead;
  allocator<char> local_3eac;
  allocator<char> local_3eab;
  allocator<char> local_3eaa;
  allocator<char> local_3ea9;
  const_string local_3ea8 [2];
  lazy_ostream local_3e88 [2];
  allocator<char> local_3e61 [17];
  assertion_result local_3e50 [2];
  const_string local_3e18 [2];
  lazy_ostream local_3df8 [2];
  allocator<char> local_3dd1 [17];
  assertion_result local_3dc0 [2];
  const_string local_3d88 [2];
  lazy_ostream local_3d68 [2];
  allocator<char> local_3d41 [17];
  assertion_result local_3d30 [2];
  const_string local_3cf8 [2];
  lazy_ostream local_3cd8 [2];
  allocator<char> local_3cb1 [17];
  assertion_result local_3ca0 [2];
  const_string local_3c68 [2];
  lazy_ostream local_3c48 [2];
  assertion_result local_3c28 [2];
  const_string local_3bf0 [2];
  lazy_ostream local_3bd0 [2];
  assertion_result local_3bb0 [2];
  allocator<char> local_3b71;
  NodeRef<typename_KeyConverter::Key> ms_ins;
  const_string local_3b60 [2];
  lazy_ostream local_3b40 [2];
  assertion_result local_3b20 [2];
  allocator<char> local_3ae1;
  NodeRef<typename_KeyConverter::Key> ms_nondup;
  const_string local_3ad0 [2];
  lazy_ostream local_3ab0 [2];
  assertion_result local_3a90 [2];
  allocator<char> local_3a51;
  NodeRef<typename_KeyConverter::Key> ms_dup4;
  const_string local_3a40 [2];
  lazy_ostream local_3a20 [2];
  assertion_result local_3a00 [2];
  allocator<char> local_39c1;
  NodeRef<typename_KeyConverter::Key> ms_dup3;
  const_string local_39b0 [2];
  lazy_ostream local_3990 [2];
  assertion_result local_3970 [2];
  allocator<char> local_3931;
  NodeRef<typename_KeyConverter::Key> ms_dup2;
  const_string local_3920 [2];
  lazy_ostream local_3900 [2];
  assertion_result local_38e0 [2];
  const_string local_38a8 [2];
  lazy_ostream local_3888 [2];
  assertion_result local_3868 [2];
  allocator<char> local_3829;
  NodeRef<typename_KeyConverter::Key> ms_dup1;
  const_string local_3818 [2];
  lazy_ostream local_37f8 [2];
  assertion_result local_37d8 [2];
  allocator<char> local_3799;
  NodeRef<typename_KeyConverter::Key> ms_minimalif;
  lazy_ostream local_3784;
  undefined1 local_3770 [68];
  lazy_ostream local_372c;
  undefined1 local_3718 [64];
  const_string local_36d8 [2];
  lazy_ostream local_36b8 [2];
  assertion_result local_3698 [2];
  allocator<char> local_3659;
  NodeRef<typename_KeyConverter::Key> ms_multi;
  allocator<char> local_3644;
  allocator<char> local_3643;
  allocator<char> local_3642;
  allocator<char> local_3641;
  allocator<char> local_3640;
  allocator<char> local_363f;
  allocator<char> local_363e;
  allocator<char> local_363d;
  allocator<char> local_363c;
  allocator<char> local_363b;
  allocator<char> local_363a;
  allocator<char> local_3639;
  const_string local_3638 [2];
  lazy_ostream local_3618 [3];
  assertion_result local_35e8 [2];
  const_string local_35b0 [2];
  lazy_ostream local_3590 [3];
  assertion_result local_3560 [2];
  const_string local_3528 [2];
  lazy_ostream local_3508 [3];
  assertion_result local_34d8 [2];
  const_string local_34a0 [2];
  lazy_ostream local_3480 [3];
  assertion_result local_3450 [2];
  undefined4 local_3418;
  allocator<char> local_3412;
  allocator<char> local_3411;
  const_string local_3410 [2];
  lazy_ostream local_33f0 [2];
  assertion_result local_33d0 [2];
  NodeRef<typename_KeyConverter::Key> ms_stack_nok;
  allocator<char> local_3382;
  allocator<char> local_3381;
  const_string local_3380 [2];
  lazy_ostream local_3360 [2];
  assertion_result local_3340 [2];
  NodeRef<typename_KeyConverter::Key> ms_stack_ok;
  allocator<char> local_32d2;
  allocator<char> local_32d1;
  char *local_32d0;
  undefined4 *local_32a0;
  undefined8 local_3298;
  undefined4 local_3290;
  allocator<char> local_328b;
  allocator<char> local_328a;
  allocator<char> local_3289;
  undefined4 local_3288;
  allocator<char> local_3282;
  allocator<char> local_3281 [24];
  allocator<char> local_3269;
  undefined4 local_3268;
  allocator<char> local_3263;
  allocator<char> local_3262;
  allocator<char> local_3261;
  const_string local_3260 [2];
  lazy_ostream local_3240 [3];
  assertion_result local_3210 [2];
  const_string local_31d8 [2];
  lazy_ostream local_31b8 [3];
  assertion_result local_3188 [2];
  const_string local_3150 [2];
  lazy_ostream local_3130 [3];
  assertion_result local_3100 [2];
  KeyConverter wsh_converter;
  KeyConverter tap_converter;
  allocator<char> local_30b3;
  allocator<char> local_30b2;
  allocator<char> local_30b1;
  undefined4 local_30b0;
  undefined4 local_30ac;
  undefined4 local_30a8;
  allocator<char> local_30a3;
  allocator<char> local_30a2;
  allocator<char> local_30a1;
  undefined4 local_30a0;
  undefined4 local_309c;
  undefined4 local_3098;
  allocator<char> local_3093;
  allocator<char> local_3092;
  allocator<char> local_3091;
  undefined4 local_3090;
  undefined4 local_308c;
  undefined4 local_3088;
  allocator<char> local_3083;
  allocator<char> local_3082;
  allocator<char> local_3081;
  undefined4 local_3080;
  undefined4 local_307c;
  undefined4 local_3078;
  allocator<char> local_3073;
  allocator<char> local_3072;
  allocator<char> local_3071;
  undefined4 local_3070;
  undefined4 local_306c;
  undefined4 local_3068;
  allocator<char> local_3063;
  allocator<char> local_3062;
  allocator<char> local_3061;
  undefined4 local_3060;
  undefined4 local_305c;
  undefined4 local_3058;
  allocator<char> local_3053;
  allocator<char> local_3052;
  allocator<char> local_3051;
  undefined4 local_3050;
  undefined4 local_304c;
  undefined4 local_3048;
  allocator<char> local_3043;
  allocator<char> local_3042;
  allocator<char> local_3041;
  undefined4 local_3040;
  undefined4 local_303c;
  undefined4 local_3038;
  allocator<char> local_3033;
  allocator<char> local_3032;
  allocator<char> local_3031;
  undefined4 local_3030;
  undefined4 local_302c;
  undefined4 local_3028;
  allocator<char> local_3023;
  allocator<char> local_3022;
  allocator<char> local_3021;
  undefined4 local_3020;
  undefined4 local_301c;
  undefined4 local_3018;
  allocator<char> local_3013;
  allocator<char> local_3012;
  allocator<char> local_3011;
  undefined4 local_3010;
  undefined4 local_300c;
  undefined4 local_3008;
  allocator<char> local_3003;
  allocator<char> local_3002;
  allocator<char> local_3001;
  undefined8 local_3000;
  undefined4 local_2ff8;
  allocator<char> local_2ff3;
  allocator<char> local_2ff2;
  allocator<char> local_2ff1;
  undefined4 local_2ff0;
  undefined4 local_2fec;
  undefined4 local_2fe8;
  allocator<char> local_2fe3;
  allocator<char> local_2fe2;
  allocator<char> local_2fe1;
  undefined4 local_2fe0;
  undefined4 local_2fdc;
  undefined4 local_2fd8;
  allocator<char> local_2fd3;
  allocator<char> local_2fd2;
  allocator<char> local_2fd1;
  undefined4 local_2fd0;
  undefined4 local_2fcc;
  undefined4 local_2fc8;
  allocator<char> local_2fc3;
  allocator<char> local_2fc2;
  allocator<char> local_2fc1;
  undefined4 local_2fc0;
  undefined4 local_2fbc;
  undefined4 local_2fb8;
  allocator<char> local_2fb3;
  allocator<char> local_2fb2;
  allocator<char> local_2fb1;
  undefined4 local_2fb0;
  undefined4 local_2fac;
  undefined4 local_2fa8;
  allocator<char> local_2fa3;
  allocator<char> local_2fa2;
  allocator<char> local_2fa1;
  undefined4 local_2fa0;
  undefined4 local_2f9c;
  undefined4 local_2f98;
  allocator<char> local_2f93;
  allocator<char> local_2f92;
  allocator<char> local_2f91;
  undefined4 local_2f90;
  undefined4 local_2f8c;
  undefined4 local_2f88;
  allocator<char> local_2f83;
  allocator<char> local_2f82;
  allocator<char> local_2f81;
  undefined4 local_2f80;
  undefined4 local_2f7c;
  undefined4 local_2f78;
  allocator<char> local_2f73;
  allocator<char> local_2f72;
  allocator<char> local_2f71;
  undefined4 local_2f70;
  undefined4 local_2f6c;
  undefined4 local_2f68;
  allocator<char> local_2f63;
  allocator<char> local_2f62;
  allocator<char> local_2f61;
  undefined4 local_2f60;
  undefined4 local_2f5c;
  undefined4 local_2f58;
  allocator<char> local_2f53;
  allocator<char> local_2f52;
  allocator<char> local_2f51;
  undefined4 local_2f50;
  undefined4 local_2f4c;
  undefined4 local_2f48;
  allocator<char> local_2f43;
  allocator<char> local_2f42;
  allocator<char> local_2f41;
  undefined4 local_2f40;
  undefined4 local_2f3c;
  undefined4 local_2f38;
  allocator<char> local_2f33;
  allocator<char> local_2f32;
  allocator<char> local_2f31;
  undefined4 local_2f30;
  undefined4 local_2f2c;
  undefined4 local_2f28;
  allocator<char> local_2f23;
  allocator<char> local_2f22;
  allocator<char> local_2f21;
  undefined4 local_2f20;
  undefined4 local_2f1c;
  undefined4 local_2f18;
  allocator<char> local_2f13;
  allocator<char> local_2f12;
  allocator<char> local_2f11;
  undefined4 local_2f10;
  undefined4 local_2f0c;
  undefined4 local_2f08;
  allocator<char> local_2f03;
  allocator<char> local_2f02;
  allocator<char> local_2f01;
  undefined4 local_2f00;
  undefined4 local_2efc;
  undefined4 local_2ef8;
  allocator<char> local_2ef3;
  allocator<char> local_2ef2;
  allocator<char> local_2ef1;
  undefined4 local_2ef0;
  undefined4 local_2eec;
  undefined4 local_2ee8;
  allocator<char> local_2ee3;
  allocator<char> local_2ee2;
  allocator<char> local_2ee1;
  undefined4 local_2ee0;
  undefined4 local_2edc;
  undefined4 local_2ed8;
  allocator<char> local_2ed1;
  allocator<char> local_2ed0;
  allocator<char> local_2ecf;
  allocator<char> local_2ece;
  allocator<char> local_2ecd;
  allocator<char> local_2ecc;
  allocator<char> local_2ecb;
  allocator<char> local_2eca;
  allocator<char> local_2ec9;
  allocator<char> local_2ec8;
  allocator<char> local_2ec7;
  allocator<char> local_2ec6;
  allocator<char> local_2ec5;
  allocator<char> local_2ec4;
  allocator<char> local_2ec3;
  allocator<char> local_2ec2;
  allocator<char> local_2ec1;
  allocator<char> local_2ec0;
  allocator<char> local_2ebf;
  allocator<char> local_2ebe;
  allocator<char> local_2ebd;
  allocator<char> local_2ebc;
  allocator<char> local_2ebb;
  allocator<char> local_2eba;
  allocator<char> local_2eb9;
  allocator<char> local_2eb8;
  allocator<char> local_2eb7;
  allocator<char> local_2eb6;
  allocator<char> local_2eb5;
  allocator<char> local_2eb4;
  allocator<char> local_2eb3;
  allocator<char> local_2eb2;
  allocator<char> local_2eb1;
  allocator<char> local_2eb0;
  allocator<char> local_2eaf;
  allocator<char> local_2eae;
  allocator<char> local_2ead;
  allocator<char> local_2eac;
  allocator<char> local_2eab;
  allocator<char> local_2eaa;
  allocator<char> local_2ea9;
  allocator<char> local_2ea8;
  allocator<char> local_2ea7;
  allocator<char> local_2ea6;
  allocator<char> local_2ea5;
  allocator<char> local_2ea4;
  allocator<char> local_2ea3;
  allocator<char> local_2ea2;
  allocator<char> local_2ea1;
  allocator<char> local_2ea0;
  allocator<char> local_2e9f;
  allocator<char> local_2e9e;
  allocator<char> local_2e9d;
  allocator<char> local_2e9c;
  allocator<char> local_2e9b;
  allocator<char> local_2e9a;
  allocator<char> local_2e99;
  allocator<char> local_2e98;
  allocator<char> local_2e97;
  allocator<char> local_2e96;
  allocator<char> local_2e95;
  allocator<char> local_2e94;
  allocator<char> local_2e93;
  allocator<char> local_2e92;
  allocator<char> local_2e91;
  allocator<char> local_2e90;
  allocator<char> local_2e8f;
  allocator<char> local_2e8e;
  allocator<char> local_2e8d;
  allocator<char> local_2e8c;
  allocator<char> local_2e8b;
  allocator<char> local_2e8a;
  allocator<char> local_2e89;
  allocator<char> local_2e88;
  allocator<char> local_2e87;
  allocator<char> local_2e86;
  allocator<char> local_2e85;
  allocator<char> local_2e84;
  allocator<char> local_2e83;
  allocator<char> local_2e82;
  allocator<char> local_2e81;
  allocator<char> local_2e80;
  allocator<char> local_2e7f;
  allocator<char> local_2e7e;
  allocator<char> local_2e7d;
  allocator<char> local_2e7c;
  allocator<char> local_2e7b;
  allocator<char> local_2e7a;
  allocator<char> local_2e79;
  allocator<char> local_2e78;
  allocator<char> local_2e77;
  allocator<char> local_2e76;
  allocator<char> local_2e75;
  allocator<char> local_2e74;
  allocator<char> local_2e73;
  allocator<char> local_2e72;
  allocator<char> local_2e71;
  allocator<char> local_2e70;
  allocator<char> local_2e6f;
  allocator<char> local_2e6e;
  allocator<char> local_2e6d;
  allocator<char> local_2e6c;
  allocator<char> local_2e6b;
  allocator<char> local_2e6a;
  allocator<char> local_2e69;
  allocator<char> local_2e68;
  allocator<char> local_2e67;
  allocator<char> local_2e66;
  allocator<char> local_2e65;
  allocator<char> local_2e64;
  allocator<char> local_2e63;
  allocator<char> local_2e62;
  allocator<char> local_2e61;
  allocator<char> local_2e60;
  allocator<char> local_2e5f;
  allocator<char> local_2e5e;
  allocator<char> local_2e5d;
  allocator<char> local_2e5c;
  allocator<char> local_2e5b;
  allocator<char> local_2e5a;
  allocator<char> local_2e59;
  allocator<char> local_2e58;
  allocator<char> local_2e57;
  allocator<char> local_2e56;
  allocator<char> local_2e55;
  allocator<char> local_2e54;
  allocator<char> local_2e53;
  allocator<char> local_2e52;
  allocator<char> local_2e51;
  allocator<char> local_2e50;
  allocator<char> local_2e4f;
  allocator<char> local_2e4e;
  allocator<char> local_2e4d;
  allocator<char> local_2e4c;
  allocator<char> local_2e4b;
  allocator<char> local_2e4a;
  allocator<char> local_2e49;
  allocator<char> local_2e48;
  allocator<char> local_2e47;
  allocator<char> local_2e46;
  allocator<char> local_2e45;
  allocator<char> local_2e44;
  allocator<char> local_2e43;
  allocator<char> local_2e42;
  allocator<char> local_2e41;
  allocator<char> local_2e40;
  allocator<char> local_2e3f;
  allocator<char> local_2e3e;
  allocator<char> local_2e3d;
  allocator<char> local_2e3c;
  allocator<char> local_2e3b;
  allocator<char> local_2e3a;
  allocator<char> local_2e39;
  allocator<char> local_2e38;
  allocator<char> local_2e37;
  allocator<char> local_2e36;
  allocator<char> local_2e35;
  allocator<char> local_2e34;
  allocator<char> local_2e33;
  allocator<char> local_2e32;
  allocator<char> local_2e31;
  allocator<char> local_2e30;
  allocator<char> local_2e2f;
  allocator<char> local_2e2e;
  allocator<char> local_2e2d;
  _Optional_payload_base<unsigned_int> local_2e2c;
  _Optional_payload_base<unsigned_int> local_2e24;
  Node<CPubKey> *local_2e1c;
  Node<CPubKey> *local_2e14;
  lazy_ostream *local_2e0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e04;
  assertion_result *local_2dfc;
  Node<CPubKey> *local_2df4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2dec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2de4;
  Node<CPubKey> *local_2ddc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2dd4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2dcc;
  Node<CPubKey> *local_2dc4;
  optional<unsigned_int> *local_2db4;
  int *local_2dac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d94;
  array<unsigned_char,_3UL> no_pubkey;
  assertion_result *local_2d80;
  lazy_ostream *local_2d78;
  optional<unsigned_int> *local_2d68;
  int *local_2d60;
  optional<unsigned_int> *local_2d50;
  int *local_2d48;
  optional<unsigned_int> *local_2d38;
  int *local_2d30;
  optional<unsigned_int> *local_2d20;
  int *local_2d18;
  optional<unsigned_int> *local_2d08;
  int *local_2d00;
  optional<unsigned_int> *local_2cf0;
  int *local_2ce8;
  optional<unsigned_int> *local_2cd8;
  int *local_2cd0;
  optional<unsigned_int> *local_2cc0;
  int *local_2cb8;
  optional<unsigned_int> *local_2ca8;
  int *local_2ca0;
  optional<unsigned_int> *local_2c90;
  int *local_2c88;
  optional<unsigned_int> *local_2c78;
  int *local_2c70;
  optional<unsigned_int> *local_2c60;
  int *local_2c58;
  optional<unsigned_int> *local_2c48;
  int *local_2c40;
  optional<unsigned_int> *local_2c30;
  int *local_2c28;
  optional<unsigned_int> *local_2c18;
  int *local_2c10;
  optional<unsigned_int> *local_2c00;
  int *local_2bf8;
  optional<unsigned_int> *local_2be8;
  int *local_2be0;
  optional<unsigned_int> *local_2bd0;
  int *local_2bc8;
  optional<unsigned_int> *local_2bb8;
  int *local_2bb0;
  optional<unsigned_int> *local_2ba0;
  int *local_2b98;
  optional<unsigned_int> *local_2b88;
  int *local_2b80;
  optional<unsigned_int> *local_2b70;
  int *local_2b68;
  optional<unsigned_int> *local_2b58;
  int *local_2b50;
  optional<unsigned_int> *local_2b40;
  int *local_2b38;
  optional<unsigned_int> *local_2b28;
  int *local_2b20;
  optional<unsigned_int> *local_2b10;
  int *local_2b08;
  optional<unsigned_int> *local_2af8;
  int *local_2af0;
  optional<unsigned_int> *local_2ae0;
  int *local_2ad8;
  optional<unsigned_int> *local_2ac8;
  int *local_2ac0;
  optional<unsigned_int> *local_2ab0;
  int *local_2aa8;
  CScript nonminverify_script;
  array<unsigned_char,_37UL> nonminverify;
  CScript nonminpush_script;
  array<unsigned_char,_96UL> nonminpush;
  string ms_stack_limit;
  string ms_str_large;
  undefined4 local_2204;
  undefined4 local_2200;
  undefined4 local_21fc;
  string ms_str_multi_a;
  array<unsigned_char,_71UL> incomplete_multi_a_2;
  array<unsigned_char,_37UL> incomplete_multi_a;
  
  local_3000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x228);
  anon_unknown.dwarf_6f47f7::TestData::TestData(in_stack_ffffffffffffb538);
  std::
  unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
  ::reset((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
           *)in_stack_ffffffffffffb348,(pointer)0x784523);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e2f);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e2e);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e32);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e31);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e35);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e34);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e33);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e38);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e37);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e36);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e3b);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e3a);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e3e);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e3d);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e41);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e40);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e44);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e43);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e42);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e47);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e46);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e45);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e4a);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e49);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e4d);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e4c);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e4b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e50);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e4f);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e4e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e53);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e52);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e56);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e55);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e54);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e59);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e58);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e5c);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e5b);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e5a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e5f);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e5e);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e5d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e62);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e61);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e65);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e64);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e63);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e68);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e67);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e66);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e6b);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e6a);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e6e);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e6d);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e6c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e71);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e70);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e74);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e73);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e72);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e77);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e76);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e75);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e7a);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e79);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e7d);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e7c);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e7b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e80);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e7f);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e7e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e83);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e82);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e86);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e85);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e84);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e89);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e88);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e87);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e8c);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e8b);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e8a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e8f);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e8e);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e8d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e92);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e91);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e95);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e94);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e93);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e98);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e97);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e96);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e9b);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e9a);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e9e);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e9d);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e9c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea1);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea0);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2e9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea4);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea3);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea7);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea6);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eaa);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea9);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ead);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eac);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eab);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb0);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eaf);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eae);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb3);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb2);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb6);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb5);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb9);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb8);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eb7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ebc);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ebb);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ebf);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ebe);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ebd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec2);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec1);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec5);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec4);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec8);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec7);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ecb);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2eca);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ece);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  std::allocator<char>::~allocator(&local_2ecd);
  std::__cxx11::string::~string(in_stack_ffffffffffffb348);
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffb348 >> 0x20);
  std::allocator<char>::~allocator(&local_2ecc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2ed8 = 3;
  std::optional<unsigned_int>::optional<int,_true>
            (in_stack_ffffffffffffb358,in_stack_ffffffffffffb350);
  local_2edc = 3;
  std::optional<unsigned_int>::optional<int,_true>
            (in_stack_ffffffffffffb358,in_stack_ffffffffffffb350);
  local_2ee0 = 3;
  std::optional<unsigned_int>::optional<int,_true>
            (in_stack_ffffffffffffb358,in_stack_ffffffffffffb350);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ed1);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ed0);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2ecf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2ee8 = 0x97;
  std::optional<unsigned_int>::optional<int,_true>(local_2ab0,local_2aa8);
  local_2eec = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2ab0,local_2aa8);
  local_2ef0 = 7;
  std::optional<unsigned_int>::optional<int,_true>(local_2ab0,local_2aa8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,5);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ee3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ee2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2ef8 = 0x97;
  std::optional<unsigned_int>::optional<int,_true>(local_2ac8,local_2ac0);
  local_2efc = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2ac8,local_2ac0);
  local_2f00 = 8;
  std::optional<unsigned_int>::optional<int,_true>(local_2ac8,local_2ac0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,5);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ef3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ef2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2ef1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f08 = 2;
  std::optional<unsigned_int>::optional<int,_true>(local_2ae0,local_2ad8);
  local_2f0c = 2;
  std::optional<unsigned_int>::optional<int,_true>(local_2ae0,local_2ad8);
  local_2f10 = 2;
  std::optional<unsigned_int>::optional<int,_true>(local_2ae0,local_2ad8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,1);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f03);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f02);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f18 = 0x44;
  std::optional<unsigned_int>::optional<int,_true>(local_2af8,local_2af0);
  local_2f1c = 0x44;
  std::optional<unsigned_int>::optional<int,_true>(local_2af8,local_2af0);
  local_2f20 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2af8,local_2af0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f13);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f12);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f28 = 0xdc;
  std::optional<unsigned_int>::optional<int,_true>(local_2b10,local_2b08);
  local_2f2c = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2b10,local_2b08);
  local_2f30 = 10;
  std::optional<unsigned_int>::optional<int,_true>(local_2b10,local_2b08);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,5);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f23);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f22);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f38 = 0xdf;
  std::optional<unsigned_int>::optional<int,_true>(local_2b28,local_2b20);
  local_2f3c = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2b28,local_2b20);
  local_2f40 = 10;
  std::optional<unsigned_int>::optional<int,_true>(local_2b28,local_2b20);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,7);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f33);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f32);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f48 = 0x21;
  std::optional<unsigned_int>::optional<int,_true>(local_2b40,local_2b38);
  local_2f4c = 0x21;
  std::optional<unsigned_int>::optional<int,_true>(local_2b40,local_2b38);
  local_2f50 = 3;
  std::optional<unsigned_int>::optional<int,_true>(local_2b40,local_2b38);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,1);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f43);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f42);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f58 = 0xb6;
  std::optional<unsigned_int>::optional<int,_true>(local_2b58,local_2b50);
  local_2f5c = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2b58,local_2b50);
  local_2f60 = 8;
  std::optional<unsigned_int>::optional<int,_true>(local_2b58,local_2b50);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,5);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f53);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f52);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f68 = 0x95;
  std::optional<unsigned_int>::optional<int,_true>(local_2b70,local_2b68);
  local_2f6c = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2b70,local_2b68);
  local_2f70 = 8;
  std::optional<unsigned_int>::optional<int,_true>(local_2b70,local_2b68);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,4);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f63);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f62);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f78 = 0x21;
  std::optional<unsigned_int>::optional<int,_true>(local_2b88,local_2b80);
  local_2f7c = 0x21;
  std::optional<unsigned_int>::optional<int,_true>(local_2b88,local_2b80);
  local_2f80 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2b88,local_2b80);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,1);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f73);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f72);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f88 = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2ba0,local_2b98);
  local_2f8c = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2ba0,local_2b98);
  local_2f90 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2ba0,local_2b98);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f83);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f82);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2f98 = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2bb8,local_2bb0);
  local_2f9c = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2bb8,local_2bb0);
  local_2fa0 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2bb8,local_2bb0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f93);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2f92);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2fa8 = 0xde;
  std::optional<unsigned_int>::optional<int,_true>(local_2bd0,local_2bc8);
  local_2fac = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2bd0,local_2bc8);
  local_2fb0 = 10;
  std::optional<unsigned_int>::optional<int,_true>(local_2bd0,local_2bc8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,6);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fa3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fa2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2fb8 = 0x23;
  std::optional<unsigned_int>::optional<int,_true>(local_2be8,local_2be0);
  local_2fbc = 0x23;
  std::optional<unsigned_int>::optional<int,_true>(local_2be8,local_2be0);
  local_2fc0 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2be8,local_2be0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fb3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fb2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2fc8 = 0x22;
  std::optional<unsigned_int>::optional<int,_true>(local_2c00,local_2bf8);
  local_2fcc = 0x22;
  std::optional<unsigned_int>::optional<int,_true>(local_2c00,local_2bf8);
  local_2fd0 = 3;
  std::optional<unsigned_int>::optional<int,_true>(local_2c00,local_2bf8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fc3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fc2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2fc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2fd8 = 0x6a;
  std::optional<unsigned_int>::optional<int,_true>(local_2c18,local_2c10);
  local_2fdc = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2c18,local_2c10);
  local_2fe0 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2c18,local_2c10);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fd3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fd2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2fd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2fe8 = 0xdc;
  std::optional<unsigned_int>::optional<int,_true>(local_2c30,local_2c28);
  local_2fec = 0;
  std::optional<unsigned_int>::optional<int,_true>(local_2c30,local_2c28);
  local_2ff0 = 9;
  std::optional<unsigned_int>::optional<int,_true>(local_2c30,local_2c28);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,5);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fe3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2fe2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2fe1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_2ff8 = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2c48,local_2c40);
  local_3000._4_4_ = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2c48,local_2c40);
  local_3000 = CONCAT44(local_3000._4_4_,4);
  std::optional<unsigned_int>::optional<int,_true>(local_2c48,local_2c40);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ff3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_2ff2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_2ff1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3008 = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2c60,local_2c58);
  local_300c = 0x42;
  std::optional<unsigned_int>::optional<int,_true>(local_2c60,local_2c58);
  local_3010 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2c60,local_2c58);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3003);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3002);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3018 = 0x4b;
  std::optional<unsigned_int>::optional<int,_true>(local_2c78,local_2c70);
  local_301c = 0x44;
  std::optional<unsigned_int>::optional<int,_true>(local_2c78,local_2c70);
  local_3020 = 3;
  std::optional<unsigned_int>::optional<int,_true>(local_2c78,local_2c70);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3013);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3012);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3011);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3028 = 0x65;
  std::optional<unsigned_int>::optional<int,_true>(local_2c90,local_2c88);
  local_302c = 100;
  std::optional<unsigned_int>::optional<int,_true>(local_2c90,local_2c88);
  local_3030 = 6;
  std::optional<unsigned_int>::optional<int,_true>(local_2c90,local_2c88);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,4);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3023);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3022);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3038 = 0x6c;
  std::optional<unsigned_int>::optional<int,_true>(local_2ca8,local_2ca0);
  local_303c = 0x65;
  std::optional<unsigned_int>::optional<int,_true>(local_2ca8,local_2ca0);
  local_3040 = 5;
  std::optional<unsigned_int>::optional<int,_true>(local_2ca8,local_2ca0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3033);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3032);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3031);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3048 = 0x4a;
  std::optional<unsigned_int>::optional<int,_true>(local_2cc0,local_2cb8);
  local_304c = 0x43;
  std::optional<unsigned_int>::optional<int,_true>(local_2cc0,local_2cb8);
  local_3050 = 3;
  std::optional<unsigned_int>::optional<int,_true>(local_2cc0,local_2cb8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3043);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3042);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3058 = 0x6d;
  std::optional<unsigned_int>::optional<int,_true>(local_2cd8,local_2cd0);
  local_305c = 0x65;
  std::optional<unsigned_int>::optional<int,_true>(local_2cd8,local_2cd0);
  local_3060 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2cd8,local_2cd0);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3053);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3052);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3051);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3068 = 0x6c;
  std::optional<unsigned_int>::optional<int,_true>(local_2cf0,local_2ce8);
  local_306c = 100;
  std::optional<unsigned_int>::optional<int,_true>(local_2cf0,local_2ce8);
  local_3070 = 5;
  std::optional<unsigned_int>::optional<int,_true>(local_2cf0,local_2ce8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3063);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3062);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3061);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3078 = 0x8c;
  std::optional<unsigned_int>::optional<int,_true>(local_2d08,local_2d00);
  local_307c = 0x84;
  std::optional<unsigned_int>::optional<int,_true>(local_2d08,local_2d00);
  local_3080 = 5;
  std::optional<unsigned_int>::optional<int,_true>(local_2d08,local_2d00);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3073);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3072);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3088 = 0x8e;
  std::optional<unsigned_int>::optional<int,_true>(local_2d20,local_2d18);
  local_308c = 0x86;
  std::optional<unsigned_int>::optional<int,_true>(local_2d20,local_2d18);
  local_3090 = 5;
  std::optional<unsigned_int>::optional<int,_true>(local_2d20,local_2d18);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,4);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3083);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3082);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3081);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_3098 = 0xd8;
  std::optional<unsigned_int>::optional<int,_true>(local_2d38,local_2d30);
  local_309c = 200;
  std::optional<unsigned_int>::optional<int,_true>(local_2d38,local_2d30);
  local_30a0 = 6;
  std::optional<unsigned_int>::optional<int,_true>(local_2d38,local_2d30);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,5);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3093);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3092);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_3091);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  local_30a8 = 0x4d;
  std::optional<unsigned_int>::optional<int,_true>(local_2d50,local_2d48);
  local_30ac = 0x46;
  std::optional<unsigned_int>::optional<int,_true>(local_2d50,local_2d48);
  local_30b0 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2d50,local_2d48);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_30a3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_30a2);
  std::__cxx11::string::~string(pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  std::allocator<char>::~allocator(&local_30a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::optional<unsigned_int>::optional<int,_true>(local_2d68,local_2d60);
  std::optional<unsigned_int>::optional<int,_true>(local_2d68,local_2d60);
  std::optional<unsigned_int>::optional<int,_true>(local_2d68,local_2d60);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,4);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_30b3);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_30b2);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_30b1);
  memset(&wsh_converter,0,4);
  no_pubkey._M_elems[0] = 0xac;
  no_pubkey._M_elems[1] = 'Q';
  no_pubkey._M_elems[2] = 0x9c;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pbVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::array<unsigned_char,_3UL>::begin((array<unsigned_char,_3UL> *)pbVar6);
    std::array<unsigned_char,_3UL>::end((array<unsigned_char,_3UL> *)pbVar6);
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)local_2d80,(uchar *)local_2d78,(uchar *)pbVar6);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)local_2d80,local_2d78);
    boost::test_tools::assertion_result::assertion_result
              (local_2d80,SUB81((ulong)local_2d78 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    boost::unit_test::operator<<(local_2d78,(basic_cstring<const_char> *)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3100,local_3130,local_3150,0x25a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pbVar6);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pbVar6);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)pbVar6);
    CScript::~CScript((CScript *)pbVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  memcpy(&incomplete_multi_a,&DAT_01c0207b,0x25);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pbVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::array<unsigned_char,_37UL>::begin((array<unsigned_char,_37UL> *)pbVar6);
    std::array<unsigned_char,_37UL>::end((array<unsigned_char,_37UL> *)pbVar6);
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)local_2d80,(uchar *)local_2d78,(uchar *)pbVar6);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)local_2d80,local_2d78);
    boost::test_tools::assertion_result::assertion_result
              (local_2d80,SUB81((ulong)local_2d78 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    boost::unit_test::operator<<(local_2d78,(basic_cstring<const_char> *)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3188,local_31b8,local_31d8,0x25c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pbVar6);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pbVar6);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)pbVar6);
    CScript::~CScript((CScript *)pbVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  memcpy(&incomplete_multi_a_2,&DAT_01c020a0,0x47);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pbVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::array<unsigned_char,_71UL>::begin((array<unsigned_char,_71UL> *)pbVar6);
    std::array<unsigned_char,_71UL>::end((array<unsigned_char,_71UL> *)pbVar6);
    CScript::CScript<const_unsigned_char_*>
              ((CScript *)local_2d80,(uchar *)local_2d78,(uchar *)pbVar6);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)local_2d80,local_2d78);
    boost::test_tools::assertion_result::assertion_result
              (local_2d80,SUB81((ulong)local_2d78 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    boost::unit_test::operator<<(local_2d78,(basic_cstring<const_char> *)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_2d80,(pointer)local_2d78,(unsigned_long)pbVar6);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3210,local_3240,local_3260,0x25e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pbVar6);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pbVar6);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)pbVar6);
    CScript::~CScript((CScript *)pbVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar6);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  local_3268 = 3;
  std::optional<unsigned_int>::optional<int,_true>
            ((optional<unsigned_int> *)local_2d80,(int *)local_2d78);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,2);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar7);
  std::allocator<char>::~allocator(&local_3263);
  std::__cxx11::string::~string(pbVar7);
  std::allocator<char>::~allocator(&local_3262);
  std::__cxx11::string::~string(pbVar7);
  std::allocator<char>::~allocator(&local_3261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::~allocator(&local_3269);
  pbVar6 = local_2d94;
  pbVar9 = local_2d9c;
  for (i = 0; i < 0x15; i = i + 1) {
    std::
    unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
    ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                  *)pbVar7);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)pbVar9,(size_type)pbVar6);
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)pbVar9,(CPubKey *)pbVar6,pbVar7);
    s.m_size = in_stack_ffffffffffffb3d8;
    s.m_data = (uchar *)in_stack_ffffffffffffb3d0;
    HexStr_abi_cxx11_(s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (pbVar9,pbVar6);
    std::__cxx11::string::~string(pbVar7);
    if (i < 0x14) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (pbVar9,(char *)pbVar6);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (pbVar9,(char *)pbVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar7);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar7);
  uVar8 = (undefined4)((ulong)pbVar7 >> 0x20);
  local_3288 = 0x16;
  std::optional<unsigned_int>::optional<int,_true>((optional<unsigned_int> *)pbVar9,(int *)pbVar6);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,0x15)
  ;
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3282);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(local_3281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar6);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  local_3290 = 4;
  std::optional<unsigned_int>::optional<int,_true>(local_2db4,local_2dac);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,3);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar7);
  std::allocator<char>::~allocator(&local_328b);
  std::__cxx11::string::~string(pbVar7);
  std::allocator<char>::~allocator(&local_328a);
  std::__cxx11::string::~string(pbVar7);
  std::allocator<char>::~allocator(&local_3289);
  local_2204 = 99;
  local_2200 = 0x6e;
  local_21fc = 200;
  local_32a0 = &local_2204;
  local_3298 = 3;
  __begin1 = std::initializer_list<int>::begin((initializer_list<int> *)pbVar7);
  piVar3 = std::initializer_list<int>::end((initializer_list<int> *)local_2dcc);
  pNVar10 = local_2dc4;
  pbVar6 = local_2dcc;
  pbVar9 = local_2dd4;
  for (; __begin1 != piVar3; __begin1 = __begin1 + 1) {
    iVar11 = *__begin1;
    std::__cxx11::string::string(pbVar9);
    for (i_1 = 0; i_1 < iVar11 + -1; i_1 = i_1 + 1) {
      std::
      unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
      ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                    *)pbVar7);
      std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
                ((vector<CPubKey,_std::allocator<CPubKey>_> *)pbVar6,(size_type)pNVar10);
      Span<const_unsigned_char>::Span<CPubKey>
                ((Span<const_unsigned_char> *)pbVar6,(CPubKey *)pNVar10,pbVar7);
      s_00.m_size = in_stack_ffffffffffffb3d8;
      s_00.m_data = (uchar *)in_stack_ffffffffffffb3d0;
      HexStr_abi_cxx11_(s_00);
      std::operator+((char *)pbVar9,pbVar6);
      std::operator+(pbVar9,(char *)pbVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar10
                );
      std::__cxx11::string::~string(pbVar7);
      std::__cxx11::string::~string(pbVar7);
      std::__cxx11::string::~string(pbVar7);
    }
    std::
    unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
    ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                  *)pbVar7);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)pbVar6,(size_type)pNVar10);
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)pbVar6,(CPubKey *)pNVar10,pbVar7);
    s_01.m_size = in_stack_ffffffffffffb3d8;
    s_01.m_data = (uchar *)in_stack_ffffffffffffb3d0;
    HexStr_abi_cxx11_(s_01);
    std::operator+((char *)pbVar9,pbVar6);
    std::operator+(pbVar9,(char *)pbVar6);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar10);
    std::__cxx11::string::~string(pbVar7);
    std::__cxx11::string::~string(pbVar7);
    std::__cxx11::string::~string(pbVar7);
    local_32d0 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                   (pbVar6);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)pbVar6,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)pNVar10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffb368,in_stack_ffffffffffffb390,(size_type)pbVar9,
               (char)((ulong)pbVar6 >> 0x38));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
               (allocator<char> *)in_stack_ffffffffffffb388);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
               (allocator<char> *)in_stack_ffffffffffffb388);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar7);
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar7);
    uVar8 = (undefined4)((ulong)pbVar7 >> 0x20);
    std::optional<unsigned_int>::optional<int,_true>
              ((optional<unsigned_int> *)pbVar6,(int *)pNVar10);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar8,iVar11);
    pNVar10 = local_2ddc;
    pbVar6 = local_2de4;
    pbVar9 = local_2dec;
    anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
              ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
               in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
               (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
               (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
               (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
               (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
    std::__cxx11::string::~string(pbVar7);
    std::allocator<char>::~allocator(&local_32d2);
    std::__cxx11::string::~string(pbVar7);
    std::allocator<char>::~allocator(&local_32d1);
    std::__cxx11::string::~string(pbVar7);
  }
  std::__cxx11::string::string(pbVar9);
  for (i_2 = 0; i_2 < 0x3e6; i_2 = i_2 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (pbVar6,(char *)pNVar10);
  }
  std::
  unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
  ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                *)pbVar7);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)pbVar6,(size_type)pNVar10);
  Span<const_unsigned_char>::Span<CPubKey>
            ((Span<const_unsigned_char> *)pbVar6,(CPubKey *)pNVar10,pbVar7);
  s_02.m_size = in_stack_ffffffffffffb3d8;
  s_02.m_data = (uchar *)in_stack_ffffffffffffb3d0;
  HexStr_abi_cxx11_(s_02);
  std::operator+((char *)pbVar9,pbVar6);
  std::operator+(pbVar9,(char *)pbVar6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar10);
  std::__cxx11::string::~string(pbVar7);
  std::__cxx11::string::~string(pbVar7);
  std::__cxx11::string::~string(pbVar7);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(pbVar6);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pbVar6,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pNVar10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffb368,in_stack_ffffffffffffb390,(size_type)pbVar9,
             (char)((ulong)pbVar6 >> 0x38));
  miniscript::FromString<(anonymous_namespace)::KeyConverter>(pbVar9,(KeyConverter *)pbVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pbVar6,(pointer)pNVar10,(unsigned_long)pbVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pbVar7);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       pbVar7);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)pbVar7);
      miniscript::Node<CPubKey>::CheckStackSize(pNVar10);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pbVar6,SUB81((ulong)pNVar10 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pbVar6,(pointer)pNVar10,(unsigned_long)pbVar7);
    boost::unit_test::operator<<((lazy_ostream *)pNVar10,(basic_cstring<const_char> *)pbVar7);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pbVar6,(pointer)pNVar10,(unsigned_long)pbVar7);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3340,local_3360,local_3380,0x27f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pbVar7);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pbVar7);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar7);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar7);
  uVar8 = (undefined4)((ulong)pbVar7 >> 0x20);
  std::optional<unsigned_int>::optional<int,_true>((optional<unsigned_int> *)pbVar6,(int *)pNVar10);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar8,1);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,
             (int)in_stack_ffffffffffffb3f0,(optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3382);
  std::__cxx11::string::~string(pbVar6);
  std::allocator<char>::~allocator(&local_3381);
  std::operator+((char *)in_stack_ffffffffffffb398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffb390._M_current);
  std::operator+(local_2e04,(char *)local_2dfc);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0);
  std::__cxx11::string::~string(pbVar6);
  std::__cxx11::string::~string(pbVar6);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>(local_2e04,(KeyConverter *)local_2dfc)
  ;
  pNVar10 = local_2df4;
  this_01 = local_2dfc;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)pNVar10,(unsigned_long)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pbVar6);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       pbVar6);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)pbVar6);
      miniscript::Node<CPubKey>::CheckStackSize(pNVar10);
    }
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)pNVar10 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)pNVar10,(unsigned_long)pbVar6);
    boost::unit_test::operator<<((lazy_ostream *)pNVar10,(basic_cstring<const_char> *)pbVar6);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)pNVar10,(unsigned_long)pbVar6);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_33d0,local_33f0,local_3410,0x285,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pbVar6);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pbVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    iVar11 = (int)in_stack_ffffffffffffb3f0;
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar6);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)pbVar6);
  uVar8 = (undefined4)((ulong)pbVar6 >> 0x20);
  local_3418 = 0x3e9;
  std::optional<unsigned_int>::optional<int,_true>((optional<unsigned_int> *)this_01,(int *)pNVar10)
  ;
  this_00 = (char *)CONCAT44(uVar8,1);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            ((MiniScriptTest *)in_stack_ffffffffffffb390._M_current,in_stack_ffffffffffffb388,
             in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,
             (int)((ulong)in_stack_ffffffffffffb370 >> 0x20),(int)in_stack_ffffffffffffb370,iVar11,
             (optional<unsigned_int>)in_stack_ffffffffffffb3d0,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c8,
             (optional<unsigned_int>)in_stack_ffffffffffffb3c0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3412);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3411);
  std::array<unsigned_char,_96UL>::begin((array<unsigned_char,_96UL> *)this_00);
  std::array<unsigned_char,_96UL>::end((array<unsigned_char,_96UL> *)this_00);
  CScript::CScript<const_unsigned_char_*>
            ((CScript *)local_2e14,(uchar *)local_2e0c,(uchar *)this_00);
  prev = local_2e0c;
  pNVar10 = local_2e14;
  this_02 = local_2e1c;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)pNVar10,prev);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3450,local_3480,local_34a0,0x28c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)pNVar10,prev);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_34d8,local_3508,local_3528,0x28d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::array<unsigned_char,_37UL>::begin((array<unsigned_char,_37UL> *)this_00);
  std::array<unsigned_char,_37UL>::end((array<unsigned_char,_37UL> *)this_00);
  CScript::CScript<const_unsigned_char_*>((CScript *)pNVar10,(uchar *)prev,(uchar *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)pNVar10,prev);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3560,local_3590,local_35b0,0x291,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_ffffffffffffb390._M_current,
               (KeyConverter *)in_stack_ffffffffffffb388);
    std::operator==((shared_ptr<const_miniscript::Node<CPubKey>_> *)pNVar10,prev);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_35e8,local_3618,local_3638,0x292,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_363b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_363a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_363e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_363d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_363c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3641);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3640);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_363f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3644);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3643);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3642);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3659);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    boost::test_tools::assertion_result::
    assertion_result<std::shared_ptr<miniscript::Node<CPubKey>const>>
              ((assertion_result *)pNVar10,(shared_ptr<const_miniscript::Node<CPubKey>_> *)prev);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3698,local_36b8,local_36d8,0x29d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this_00);
    local_2e24 = (_Optional_payload_base<unsigned_int>)miniscript::Node<CPubKey>::GetOps(pNVar10);
    puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)this_00);
    local_372c._vptr_lazy_ostream._0_4_ = 4;
    pNVar10 = (Node<CPubKey> *)0x1c17ce0;
    prev = &local_372c;
    this_00 = "*ms_multi->GetOps()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_3718,(undefined1 *)((long)&local_372c._vptr_lazy_ostream + 4),0x29e,1,2,puVar4)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this_00);
    local_2e2c = (_Optional_payload_base<unsigned_int>)
                 miniscript::Node<CPubKey>::GetStackSize(pNVar10);
    puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)this_00);
    local_3784._vptr_lazy_ostream._0_4_ = 2;
    pNVar10 = (Node<CPubKey> *)0x1bc65e2;
    prev = &local_3784;
    this_00 = "*ms_multi->GetStackSize()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (local_3770,(undefined1 *)((long)&local_3784._vptr_lazy_ostream + 4),0x29f,1,2,puVar4)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3799);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       this_00);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      miniscript::Node<CPubKey>::IsValid(this_02);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_37d8,local_37f8,local_3818,0x2a8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3829);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    boost::test_tools::assertion_result::
    assertion_result<std::shared_ptr<miniscript::Node<CPubKey>const>>
              ((assertion_result *)pNVar10,(shared_ptr<const_miniscript::Node<CPubKey>_> *)prev);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3868,local_3888,local_38a8,0x2ab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this_00);
    bVar2 = miniscript::Node<CPubKey>::IsSane(pNVar10);
    if (!bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      miniscript::Node<CPubKey>::CheckDuplicateKey(pNVar10);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_38e0,local_3900,local_3920,0x2ac,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3931);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       this_00);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      bVar2 = miniscript::Node<CPubKey>::IsSane(pNVar10);
      if (!bVar2) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this_00);
        miniscript::Node<CPubKey>::CheckDuplicateKey(pNVar10);
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3970,local_3990,local_39b0,0x2af,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_39c1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       this_00);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      bVar2 = miniscript::Node<CPubKey>::IsSane(pNVar10);
      if (!bVar2) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this_00);
        miniscript::Node<CPubKey>::CheckDuplicateKey(pNVar10);
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3a00,local_3a20,local_3a40,0x2b2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3a51);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       this_00);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      bVar2 = miniscript::Node<CPubKey>::IsSane(pNVar10);
      if (!bVar2) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this_00);
        miniscript::Node<CPubKey>::CheckDuplicateKey(pNVar10);
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3a90,local_3ab0,local_3ad0,0x2b5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3ae1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       this_00);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      bVar2 = miniscript::Node<CPubKey>::CheckDuplicateKey(pNVar10);
      if (bVar2) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this_00);
        miniscript::Node<CPubKey>::IsSane(pNVar10);
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3b20,local_3b40,local_3b60,0x2b8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)this_02,(KeyConverter *)pNVar10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3b71);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                       this_00);
    if (bVar2) {
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this_00);
      bVar2 = miniscript::Node<CPubKey>::IsValid(this_02);
      if (bVar2) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this_00);
        miniscript::Node<CPubKey>::IsSane(pNVar10);
      }
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3bb0,local_3bd0,local_3bf0,0x2bf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this_00);
  pNVar5 = miniscript::Node<CPubKey>::FindInsaneSub(pNVar10);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    if (pNVar5 != (Node<CPubKey> *)0x0) {
      miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>
                (in_stack_ffffffffffffb368,(KeyConverter *)this_02);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pNVar10,
                      (char *)prev);
    }
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c28,local_3c48,local_3c68,0x2c1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    if (pNVar5 != (Node<CPubKey> *)0x0) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    }
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
               (allocator<char> *)in_stack_ffffffffffffb388);
    miniscript::FromString<(anonymous_namespace)::KeyConverter>
              ((string *)this_02,(KeyConverter *)pNVar10);
    std::__shared_ptr::operator_cast_to_bool
              ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)this_00)
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3ca0,local_3cd8,local_3cf8,0x2c4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_3cb1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
               (allocator<char> *)in_stack_ffffffffffffb388);
    miniscript::FromString<(anonymous_namespace)::KeyConverter>
              ((string *)this_02,(KeyConverter *)pNVar10);
    std::__shared_ptr::operator_cast_to_bool
              ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)this_00)
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d30,local_3d68,local_3d88,0x2c5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_3d41);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
               (allocator<char> *)in_stack_ffffffffffffb388);
    miniscript::FromString<(anonymous_namespace)::KeyConverter>
              ((string *)this_02,(KeyConverter *)pNVar10);
    std::__shared_ptr::operator_cast_to_bool
              ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)this_00)
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3dc0,local_3df8,local_3e18,0x2c6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_3dd1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffb388,
               (const_string *)in_stack_ffffffffffffb380,(size_t)in_stack_ffffffffffffb378,
               in_stack_ffffffffffffb370);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
               (allocator<char> *)in_stack_ffffffffffffb388);
    miniscript::FromString<(anonymous_namespace)::KeyConverter>
              ((string *)this_02,(KeyConverter *)pNVar10);
    std::__shared_ptr::operator_cast_to_bool
              ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)this_00)
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)pNVar10,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)pNVar10,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e50,local_3e88,local_3ea8,0x2c7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_3e61);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eab);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eaa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eae);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3ead);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,(int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_3eb2 + 1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eb0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eaf);
  this_03 = (MiniScriptTest *)local_3eb2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  ms = (string *)&local_3eb3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  hexscript = (string *)&local_3eb4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffb398,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (this_03,ms,hexscript,in_stack_ffffffffffffb398,
             (int)((ulong)in_stack_ffffffffffffb390._M_current >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_3eb4);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_3eb3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_3eb2);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3eb5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar6,in_stack_ffffffffffffb390._M_current,
             (allocator<char> *)in_stack_ffffffffffffb388);
  __s = &local_3eb6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar6,(char *)__s,(allocator<char> *)in_stack_ffffffffffffb388);
  __a = &local_3eb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar6,(char *)__s,__a);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (this_03,ms,hexscript,pbVar6,(int)((ulong)__s >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eb7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eb6);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_3eb5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar6,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar6,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar6,(char *)__s,__a);
  anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
            (this_03,ms,hexscript,pbVar6,(int)((ulong)__s >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eba);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eb9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_3eb8);
  std::
  unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
  ::reset((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
           *)this_00,(pointer)0x793f1e);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  CScript::~CScript((CScript *)this_00);
  CScript::~CScript((CScript *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fixed_tests)
{
    g_testdata.reset(new TestData());

    // Validity rules
    Test("l:older(1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // older(1): valid
    Test("l:older(0)", "?", "?", TESTMODE_INVALID); // older(0): k must be at least 1
    Test("l:older(2147483647)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // older(2147483647): valid
    Test("l:older(2147483648)", "?", "?", TESTMODE_INVALID); // older(2147483648): k must be below 2^31
    Test("u:after(1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // after(1): valid
    Test("u:after(0)", "?", "?", TESTMODE_INVALID); // after(0): k must be at least 1
    Test("u:after(2147483647)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // after(2147483647): valid
    Test("u:after(2147483648)", "?", "?", TESTMODE_INVALID); // after(2147483648): k must be below 2^31
    Test("andor(0,1,1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // andor(Bdu,B,B): valid
    Test("andor(a:0,1,1)", "?", "?", TESTMODE_INVALID); // andor(Wdu,B,B): X must be B
    Test("andor(0,a:1,a:1)", "?", "?", TESTMODE_INVALID); // andor(Bdu,W,W): Y and Z must be B/V/K
    Test("andor(1,1,1)", "?", "?", TESTMODE_INVALID); // andor(Bu,B,B): X must be d
    Test("andor(n:or_i(0,after(1)),1,1)", "?", "?", TESTMODE_VALID); // andor(Bdu,B,B): valid
    Test("andor(or_i(0,after(1)),1,1)", "?", "?", TESTMODE_INVALID); // andor(Bd,B,B): X must be u
    Test("c:andor(0,pk_k(03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7),pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // andor(Bdu,K,K): valid
    Test("t:andor(0,v:1,v:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // andor(Bdu,V,V): valid
    Test("and_v(v:1,1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // and_v(V,B): valid
    Test("t:and_v(v:1,v:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // and_v(V,V): valid
    Test("c:and_v(v:1,pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // and_v(V,K): valid
    Test("and_v(1,1)", "?", "?", TESTMODE_INVALID); // and_v(B,B): X must be V
    Test("and_v(pk_k(02352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5),1)", "?", "?", TESTMODE_INVALID); // and_v(K,B): X must be V
    Test("and_v(v:1,a:1)", "?", "?", TESTMODE_INVALID); // and_v(K,W): Y must be B/V/K
    Test("and_b(1,a:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // and_b(B,W): valid
    Test("and_b(1,1)", "?", "?", TESTMODE_INVALID); // and_b(B,B): Y must W
    Test("and_b(v:1,a:1)", "?", "?", TESTMODE_INVALID); // and_b(V,W): X must be B
    Test("and_b(a:1,a:1)", "?", "?", TESTMODE_INVALID); // and_b(W,W): X must be B
    Test("and_b(pk_k(025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),a:1)", "?", "?", TESTMODE_INVALID); // and_b(K,W): X must be B
    Test("or_b(0,a:0)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // or_b(Bd,Wd): valid
    Test("or_b(1,a:0)", "?", "?", TESTMODE_INVALID); // or_b(B,Wd): X must be d
    Test("or_b(0,a:1)", "?", "?", TESTMODE_INVALID); // or_b(Bd,W): Y must be d
    Test("or_b(0,0)", "?", "?", TESTMODE_INVALID); // or_b(Bd,Bd): Y must W
    Test("or_b(v:0,a:0)", "?", "?", TESTMODE_INVALID); // or_b(V,Wd): X must be B
    Test("or_b(a:0,a:0)", "?", "?", TESTMODE_INVALID); // or_b(Wd,Wd): X must be B
    Test("or_b(pk_k(025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),a:0)", "?", "?", TESTMODE_INVALID); // or_b(Kd,Wd): X must be B
    Test("t:or_c(0,v:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // or_c(Bdu,V): valid
    Test("t:or_c(a:0,v:1)", "?", "?", TESTMODE_INVALID); // or_c(Wdu,V): X must be B
    Test("t:or_c(1,v:1)", "?", "?", TESTMODE_INVALID); // or_c(Bu,V): X must be d
    Test("t:or_c(n:or_i(0,after(1)),v:1)", "?", "?", TESTMODE_VALID); // or_c(Bdu,V): valid
    Test("t:or_c(or_i(0,after(1)),v:1)", "?", "?", TESTMODE_INVALID); // or_c(Bd,V): X must be u
    Test("t:or_c(0,1)", "?", "?", TESTMODE_INVALID); // or_c(Bdu,B): Y must be V
    Test("or_d(0,1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // or_d(Bdu,B): valid
    Test("or_d(a:0,1)", "?", "?", TESTMODE_INVALID); // or_d(Wdu,B): X must be B
    Test("or_d(1,1)", "?", "?", TESTMODE_INVALID); // or_d(Bu,B): X must be d
    Test("or_d(n:or_i(0,after(1)),1)", "?", "?", TESTMODE_VALID); // or_d(Bdu,B): valid
    Test("or_d(or_i(0,after(1)),1)", "?", "?", TESTMODE_INVALID); // or_d(Bd,B): X must be u
    Test("or_d(0,v:1)", "?", "?", TESTMODE_INVALID); // or_d(Bdu,V): Y must be B
    Test("or_i(1,1)", "?", "?", TESTMODE_VALID); // or_i(B,B): valid
    Test("t:or_i(v:1,v:1)", "?", "?", TESTMODE_VALID); // or_i(V,V): valid
    Test("c:or_i(pk_k(03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7),pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // or_i(K,K): valid
    Test("or_i(a:1,a:1)", "?", "?", TESTMODE_INVALID); // or_i(W,W): X and Y must be B/V/K
    Test("or_b(l:after(100),al:after(1000000000))", "?", "?", TESTMODE_VALID); // or_b(timelock, heighlock) valid
    Test("and_b(after(100),a:after(1000000000))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TIMELOCKMIX); // and_b(timelock, heighlock) invalid
    Test("pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // alias to c:pk_k
    Test("pkh(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)", "76a914fcd35ddacad9f2d5be5e464639441c6065e6955d88ac", "76a914fd1690c37fa3b0f04395ddc9415b220ab1ccc59588ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // alias to c:pk_h

    // Randomly generated test set that covers the majority of type and node type combinations
    Test("lltvln:after(1231488000)", "6300676300676300670400046749b1926869516868", "=", TESTMODE_VALID | TESTMODE_NONMAL, 12, 3, 3, 3, 3);
    Test("uuj:and_v(v:multi(2,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a,025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),after(1231488000))", "6363829263522103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a21025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc52af0400046749b168670068670068", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 14, 5, 2 + 2 + 1 + 2 * 73, 0, 7);
    Test("or_b(un:multi(2,03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729,024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),al:older(16))", "63522103daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee872921024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c9752ae926700686b63006760b2686c9b", "?", TESTMODE_VALID | TESTMODE_TAPSCRIPT_INVALID, 14, 5, 2 + 1 + 2 * 73 + 2, 0, 8);
    Test("j:and_v(vdv:after(1567547623),older(2016))", "829263766304e7e06e5db169686902e007b268", "=", TESTMODE_VALID | TESTMODE_NONMAL, 11, 1, 2, 2, 2);
    Test("t:and_v(vu:hash256(131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b),v:sha256(ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc5))", "6382012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876700686982012088a820ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc58851", "6382012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876700686982012088a820ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc58851", TESTMODE_VALID | TESTMODE_NONMAL, 12, 3, 2 + 33 + 33, 2 + 33 + 33, 4);
    Test("t:andor(multi(3,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e,03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556,02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13),v:older(4194305),v:sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2))", "532102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a14602975562102e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd1353ae6482012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2886703010040b2696851", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TAPSCRIPT_INVALID, 13, 5, 1 + 3 * 73, 0, 10);
    Test("or_d(multi(1,02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9),or_b(multi(3,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,032fa2104d6b38d11b0230010559879124e42ab8dfeff5ff29dc9cdadd4ecacc3f,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a),su:after(500000)))", "512102f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f951ae73645321022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a0121032fa2104d6b38d11b0230010559879124e42ab8dfeff5ff29dc9cdadd4ecacc3f2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae7c630320a107b16700689b68", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TAPSCRIPT_INVALID, 15, 7, 2 + 1 + 3 * 73 + 1, 0, 10);
    Test("or_d(sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6),and_n(un:after(499999999),older(4194305)))", "82012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68773646304ff64cd1db19267006864006703010040b26868", "82012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68773646304ff64cd1db19267006864006703010040b26868", TESTMODE_VALID, 16, 1, 33, 33, 3);
    Test("and_v(or_i(v:multi(2,02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb),v:multi(2,03e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0a,025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc)),sha256(d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68))", "63522102c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee52103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb52af67522103e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0a21025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc52af6882012088a820d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c6887", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 11, 5, 2 + 1 + 2 * 73 + 33, 0, 8);
    Test("j:and_b(multi(2,0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798,024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),s:or_i(older(1),older(4252898)))", "82926352210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f8179821024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c9752ae7c6351b26703e2e440b2689a68", "?", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 14, 4, 1 + 2 * 73 + 2, 0, 8);
    Test("and_b(older(16),s:or_d(sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),n:after(1567547623)))", "60b27c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87736404e7e06e5db192689a", "=", TESTMODE_VALID, 12, 1, 33, 33, 4);
    Test("j:and_v(v:hash160(20195b5a3d650c17f0f29f91c33f8f6335193d07),or_d(sha256(96de8fc8c256fa1e1556d41af431cace7dca68707c78dd88c3acab8b17164c47),older(16)))", "82926382012088a91420195b5a3d650c17f0f29f91c33f8f6335193d078882012088a82096de8fc8c256fa1e1556d41af431cace7dca68707c78dd88c3acab8b17164c4787736460b26868", "=", TESTMODE_VALID, 16, 2, 33 + 33, 33 + 33, 4);
    Test("and_b(hash256(32ba476771d01e37807990ead8719f08af494723de1d228f2c2c07cc0aa40bac),a:and_b(hash256(131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b),a:older(1)))", "82012088aa2032ba476771d01e37807990ead8719f08af494723de1d228f2c2c07cc0aa40bac876b82012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876b51b26c9a6c9a", "=", TESTMODE_VALID | TESTMODE_NONMAL, 15, 2, 33 + 33, 33 + 33, 4);
    Test("thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01))", "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c721036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a0052ae6b5121036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a0051ae6c936b21022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01ac6c935287", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 13, 6, 1 + 2 * 73 + 1 + 73 + 1, 0, 10);
    Test("and_n(sha256(d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68),t:or_i(v:older(4252898),v:older(144)))", "82012088a820d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68876400676303e2e440b26967029000b269685168", "=", TESTMODE_VALID, 14, 2, 33 + 2, 33 + 2, 4);
    Test("or_d(nd:and_v(v:older(4252898),v:older(4252898)),sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6))", "766303e2e440b26903e2e440b2696892736482012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68768", "=", TESTMODE_VALID, 15, 2, 1 + 33, 1 + 33, 3);
    Test("c:and_v(or_c(sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2),v:multi(1,02c44d12c7065d812e8acf28d7cbb19f9011ecd9e9fdf281b0e6a3b5e87d22e7db)),pk_k(03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))", "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764512102c44d12c7065d812e8acf28d7cbb19f9011ecd9e9fdf281b0e6a3b5e87d22e7db51af682103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbeac", "?", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 8, 2, 33 + 73, 0, 4);
    Test("c:and_v(or_c(multi(2,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00,02352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5),v:ripemd160(1b0f3c404d12075c68c938f9f60ebea4f74941a0)),pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "5221036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a002102352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d552ae6482012088a6141b0f3c404d12075c68c938f9f60ebea4f74941a088682103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 10, 5, 1 + 2 * 73 + 73, 0, 9);
    Test("and_v(andor(hash256(8a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b25),v:hash256(939894f70e6c3a25da75da0cc2071b4076d9b006563cf635986ada2e93c0d735),v:older(50000)),after(499999999))", "82012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b2587640350c300b2696782012088aa20939894f70e6c3a25da75da0cc2071b4076d9b006563cf635986ada2e93c0d735886804ff64cd1db1", "=", TESTMODE_VALID, 14, 2, 33 + 33, 33 + 33, 4);
    Test("andor(hash256(5f8d30e655a7ba0d7596bb3ddfb1d2d20390d23b1845000e1e118b3be1b3f040),j:and_v(v:hash160(3a2bff0da9d96868e66abc4427bea4691cf61ccd),older(4194305)),ripemd160(44d90e2d3714c8663b632fcf0f9d5f22192cc4c8))", "82012088aa205f8d30e655a7ba0d7596bb3ddfb1d2d20390d23b1845000e1e118b3be1b3f040876482012088a61444d90e2d3714c8663b632fcf0f9d5f22192cc4c8876782926382012088a9143a2bff0da9d96868e66abc4427bea4691cf61ccd8803010040b26868", "=", TESTMODE_VALID, 20, 2, 33 + 33, 33 + 33, 4);
    Test("or_i(c:and_v(v:after(500000),pk_k(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),sha256(d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f946))", "630320a107b1692102c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ac6782012088a820d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f9468768", "630320a107b16920c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ac6782012088a820d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f9468768", TESTMODE_VALID | TESTMODE_NONMAL, 10, 2, 2 + 73, 2 + 66, 3);
    Test("thresh(2,c:pk_h(025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))", "76a9145dedfbf9ea599dd4e3ca6a80b333c472fd0b3f6988ac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287", "76a9141a7ac36cfa8431ab2395d701b0050045ae4a37d188ac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287", TESTMODE_VALID, 18, 4, 1 + 34 + 33 + 33, 1 + 33 + 33 + 33, 6);
    Test("and_n(sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2),uc:and_v(v:older(144),pk_k(03fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ce)))", "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764006763029000b2692103fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ceac67006868", "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764006763029000b26920fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ceac67006868", TESTMODE_VALID | TESTMODE_NEEDSIG, 13, 3, 33 + 2 + 73, 33 + 2 + 66, 5);
    Test("and_n(c:pk_k(03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729),and_b(l:older(4252898),a:older(16)))", "2103daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729ac64006763006703e2e440b2686b60b26c9a68", "20daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729ac64006763006703e2e440b2686b60b26c9a68", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TIMELOCKMIX, 12, 2, 73 + 1, 66 + 1, 3);
    Test("c:or_i(and_v(v:older(16),pk_h(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)),pk_h(026a245bf6dc698504c89a20cfded60853152b695336c28063b61c65cbd269e6b4))", "6360b26976a9149fc5dbe5efdce10374a4dd4053c93af540211718886776a9142fbd32c8dd59ee7c17e66cb6ebea7e9846c3040f8868ac", "6360b26976a9144d4421361c3289bdad06441ffaee8be8e786f1ad886776a91460d4a7bcbd08f58e58bd208d1069837d7adb16ae8868ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG, 12, 3, 2 + 34 + 73, 2 + 33 + 66, 4);
    Test("or_d(c:pk_h(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13),andor(c:pk_k(024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),older(2016),after(1567547623)))", "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac736421024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ac6404e7e06e5db16702e007b26868", "76a91421ab1a140d0d305b8ff62bdb887d9fef82c9899e88ac7364204ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ac6404e7e06e5db16702e007b26868", TESTMODE_VALID | TESTMODE_NONMAL, 13, 3, 1 + 34 + 73, 1 + 33 + 66, 5);
    Test("c:andor(ripemd160(6ad07d21fd5dfc646f0b30577045ce201616b9ba),pk_h(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e),and_v(v:hash256(8a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b25),pk_h(03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a)))", "82012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba876482012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b258876a914dd100be7d9aea5721158ebde6d6a1fd8fff93bb1886776a9149fc5dbe5efdce10374a4dd4053c93af5402117188868ac", "82012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba876482012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b258876a914a63d1e4d2ed109246c600ec8c19cce546b65b1cc886776a9144d4421361c3289bdad06441ffaee8be8e786f1ad8868ac", TESTMODE_VALID | TESTMODE_NEEDSIG, 18, 3, 33 + 34 + 73, 33 + 33 + 66, 5);
    Test("c:andor(u:ripemd160(6ad07d21fd5dfc646f0b30577045ce201616b9ba),pk_h(03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729),or_i(pk_h(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01),pk_h(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)))", "6382012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba87670068646376a9149652d86bedf43ad264362e6e6eba6eb764508127886776a914751e76e8199196d454941c45d1b3a323f1433bd688686776a91420d637c1a6404d2227f3561fdbaff5a680dba6488868ac", "6382012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba87670068646376a914ceedcb44b38bdbcb614d872223964fd3dca8a434886776a914f678d9b79045452c8c64e9309d0f0046056e26c588686776a914a2a75e1819afa208f6c89ae0da43021116dfcb0c8868ac", TESTMODE_VALID | TESTMODE_NEEDSIG, 23, 4, 2 + 33 + 34 + 73, 2 + 33 + 33 + 66, 5);
    Test("c:or_i(andor(c:pk_h(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),pk_h(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))", "6376a914fcd35ddacad9f2d5be5e464639441c6065e6955d88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9149652d86bedf43ad264362e6e6eba6eb7645081278868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac", "6376a914fd1690c37fa3b0f04395ddc9415b220ab1ccc59588ac6476a9149b652a14674a506079f574d20ca7daef6f9a66bb886776a914ceedcb44b38bdbcb614d872223964fd3dca8a43488686720d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG, 17, 5, 2 + 34 + 73 + 34 + 73, 2 + 33 + 66 + 33 + 66, 6);
    Test("thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(1000000000),altv:after(100))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670400ca9a3bb16951686c936b6300670164b16951686c935187", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670400ca9a3bb16951686c936b6300670164b16951686c935187", TESTMODE_VALID, 18, 3, 73 + 2 + 2, 66 + 2 + 2, 4);
    Test("thresh(2,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),ac:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),altv:after(1000000000),altv:after(100))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac6c936b6300670400ca9a3bb16951686c936b6300670164b16951686c935287", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac6c936b6300670400ca9a3bb16951686c936b6300670164b16951686c935287", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TIMELOCKMIX, 22, 4, 73 + 73 + 2 + 2, 66 + 66 + 2 + 2, 5);

    // Additional Tapscript-related tests
    // Edge cases when parsing multi_a from script:
    //  - no pubkey at all
    //  - no pubkey before a CHECKSIGADD
    //  - no pubkey before the CHECKSIG
    constexpr KeyConverter tap_converter{miniscript::MiniscriptContext::TAPSCRIPT};
    constexpr KeyConverter wsh_converter{miniscript::MiniscriptContext::P2WSH};
    const auto no_pubkey{"ac519c"_hex_u8};
    BOOST_CHECK(miniscript::FromScript({no_pubkey.begin(), no_pubkey.end()}, tap_converter) == nullptr);
    const auto incomplete_multi_a{"ba20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba519c"_hex_u8};
    BOOST_CHECK(miniscript::FromScript({incomplete_multi_a.begin(), incomplete_multi_a.end()}, tap_converter) == nullptr);
    const auto incomplete_multi_a_2{"ac2079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba519c"_hex_u8};
    BOOST_CHECK(miniscript::FromScript({incomplete_multi_a_2.begin(), incomplete_multi_a_2.end()}, tap_converter) == nullptr);
    // Can use multi_a under Tapscript but not P2WSH.
    Test("and_v(v:multi_a(2,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a,025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),after(1231488000))", "?", "20d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85aac205601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7ccba529d0400046749b1", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 4, 2, {}, {}, 3);
    // Can use more than 20 keys in a multi_a.
    std::string ms_str_multi_a{"multi_a(1,"};
    for (size_t i = 0; i < 21; ++i) {
        ms_str_multi_a += HexStr(g_testdata->pubkeys[i]);
        if (i < 20) ms_str_multi_a += ",";
    }
    ms_str_multi_a += ")";
    Test(ms_str_multi_a, "?", "2079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba20f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9ba20e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13ba202f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4ba20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ba205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcba202f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01ba20acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbeba20a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7ba20774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cbba20d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85aba20f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8ba20499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4ba20d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080eba20e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0aba20defdea4cdb677750a420fee807eacf21eb9898ae79b9768766e4faa04a2d4a34ba205601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7ccba202b4ea0a797a443d293ef5cff444f4979f06acfebd7e86d277475656138385b6cba204ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ba20352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5ba519c", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 22, 21, {}, {}, 22);
    // Since 'd:' is 'u' we can use it directly inside a thresh. But we can't under P2WSH.
    Test("thresh(2,dv:older(42),s:pk(025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", "?", "7663012ab269687c205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac937c20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac935287", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 12, 3, {}, {}, 4);
    // We can have a script that has more than 201 ops (n = 99), that needs a stack size > 100 (n = 110), or has a
    // script that is larger than 3600 bytes (n = 200). All that can't be under P2WSH.
    for (const auto pk_count: {99, 110, 200}) {
        std::string ms_str_large;
        for (auto i = 0; i < pk_count - 1; ++i) {
            ms_str_large += "and_b(pk(" + HexStr(g_testdata->pubkeys[i]) + "),a:";
        }
        ms_str_large += "pk(" + HexStr(g_testdata->pubkeys[pk_count - 1]) + ")";
        ms_str_large.insert(ms_str_large.end(), pk_count - 1, ')');
        Test(ms_str_large, "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, pk_count + (pk_count - 1) * 3, pk_count, {}, {}, pk_count + 1);
    }
    // We can have a script that reaches a stack size of 1000 during execution.
    std::string ms_stack_limit;
    auto count{998};
    for (auto i = 0; i < count; ++i) {
        ms_stack_limit += "and_b(older(1),a:";
    }
    ms_stack_limit += "pk(" + HexStr(g_testdata->pubkeys[0]) + ")";
    ms_stack_limit.insert(ms_stack_limit.end(), count, ')');
    const auto ms_stack_ok{miniscript::FromString(ms_stack_limit, tap_converter)};
    BOOST_CHECK(ms_stack_ok && ms_stack_ok->CheckStackSize());
    Test(ms_stack_limit, "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 4 * count + 1, 1, {}, {}, 1 + count + 1);
    // But one more element on the stack during execution will make it fail. And we'd detect that.
    count++;
    ms_stack_limit = "and_b(older(1),a:" + ms_stack_limit + ")";
    const auto ms_stack_nok{miniscript::FromString(ms_stack_limit, tap_converter)};
    BOOST_CHECK(ms_stack_nok && !ms_stack_nok->CheckStackSize());
    Test(ms_stack_limit, "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 4 * count + 1, 1, {}, {}, 1 + count + 1);

    // Misc unit tests
    // A Script with a non minimal push is invalid
    constexpr auto nonminpush{"0000210232780000feff00ffffffffffff21ff005f00ae21ae00000000060602060406564c2102320000060900fe00005f00ae21ae00100000060606060606000000000000000000000000000000000000000000000000000000000000000000"_hex_u8};
    const CScript nonminpush_script(nonminpush.begin(), nonminpush.end());
    BOOST_CHECK(miniscript::FromScript(nonminpush_script, wsh_converter) == nullptr);
    BOOST_CHECK(miniscript::FromScript(nonminpush_script, tap_converter) == nullptr);
    // A non-minimal VERIFY (<key> CHECKSIG VERIFY 1)
    constexpr auto nonminverify{"2103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7ac6951"_hex_u8};
    const CScript nonminverify_script(nonminverify.begin(), nonminverify.end());
    BOOST_CHECK(miniscript::FromScript(nonminverify_script, wsh_converter) == nullptr);
    BOOST_CHECK(miniscript::FromScript(nonminverify_script, tap_converter) == nullptr);
    // A threshold as large as the number of subs is valid.
    Test("thresh(2,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(100))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670164b16951686c935287", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670164b16951686c935287", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_NONMAL);
    // A threshold of 1 is valid.
    Test("thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_NONMAL);
    // A threshold with a k larger than the number of subs is invalid
    Test("thresh(3,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", "=", TESTMODE_INVALID);
    // A threshold with a k null is invalid
    Test("thresh(0,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", "=", TESTMODE_INVALID);
    // For CHECKMULTISIG the OP cost is the number of keys, but the stack size is the number of sigs (+1)
    const auto ms_multi = miniscript::FromString("multi(1,03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65,03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556,0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)", wsh_converter);
    BOOST_CHECK(ms_multi);
    BOOST_CHECK_EQUAL(*ms_multi->GetOps(), 4); // 3 pubkeys + CMS
    BOOST_CHECK_EQUAL(*ms_multi->GetStackSize(), 2); // 1 sig + dummy elem
    // The 'd:' wrapper leaves on the stack what was DUP'ed at the beginning of its execution.
    // Since it contains an OP_IF just after on the same element, we can make sure that the element
    // in question must be OP_1 if OP_IF enforces that its argument must only be OP_1 or the empty
    // vector (since otherwise the execution would immediately fail). This is the MINIMALIF rule.
    // Unfortunately, this rule is consensus for Taproot but only policy for P2WSH. Therefore we can't
    // (for now) have 'd:' be 'u'. This tests we can't use a 'd:' wrapper for a thresh, which requires
    // its subs to all be 'u' (taken from https://github.com/rust-bitcoin/rust-miniscript/discussions/341).
    const auto ms_minimalif = miniscript::FromString("thresh(3,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),sc:pk_k(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798),sdv:older(32))", wsh_converter);
    BOOST_CHECK(ms_minimalif && !ms_minimalif->IsValid());
    // A Miniscript with duplicate keys is not sane
    const auto ms_dup1 = miniscript::FromString("and_v(v:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", wsh_converter);
    BOOST_CHECK(ms_dup1);
    BOOST_CHECK(!ms_dup1->IsSane() && !ms_dup1->CheckDuplicateKey());
    // Same with a disjunction, and different key nodes (pk and pkh)
    const auto ms_dup2 = miniscript::FromString("or_b(c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),ac:pk_h(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", wsh_converter);
    BOOST_CHECK(ms_dup2 && !ms_dup2->IsSane() && !ms_dup2->CheckDuplicateKey());
    // Same when the duplicates are leaves or a larger tree
    const auto ms_dup3 = miniscript::FromString("or_i(and_b(pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),s:pk(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556)),and_b(older(1),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)))", wsh_converter);
    BOOST_CHECK(ms_dup3 && !ms_dup3->IsSane() && !ms_dup3->CheckDuplicateKey());
    // Same when the duplicates are on different levels in the tree
    const auto ms_dup4 = miniscript::FromString("thresh(2,pkh(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),s:pk(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),a:and_b(dv:older(1),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)))", wsh_converter);
    BOOST_CHECK(ms_dup4 && !ms_dup4->IsSane() && !ms_dup4->CheckDuplicateKey());
    // Sanity check the opposite is true, too. An otherwise sane Miniscript with no duplicate keys is sane.
    const auto ms_nondup = miniscript::FromString("pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)", wsh_converter);
    BOOST_CHECK(ms_nondup && ms_nondup->CheckDuplicateKey() && ms_nondup->IsSane());
    // Test we find the first insane sub closer to be a leaf node. This fragment is insane for two reasons:
    // 1. It can be spent without a signature
    // 2. It contains timelock mixes
    // We'll report the timelock mix error, as it's "deeper" (closer to be a leaf node) than the "no 's' property"
    // error is.
    const auto ms_ins = miniscript::FromString("or_i(and_b(after(1),a:after(1000000000)),pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))", wsh_converter);
    BOOST_CHECK(ms_ins && ms_ins->IsValid() && !ms_ins->IsSane());
    const auto insane_sub = ms_ins->FindInsaneSub();
    BOOST_CHECK(insane_sub && *insane_sub->ToString(wsh_converter) == "and_b(after(1),a:after(1000000000))");

    // Numbers can't be prefixed by a sign.
    BOOST_CHECK(!miniscript::FromString("after(-1)", wsh_converter));
    BOOST_CHECK(!miniscript::FromString("after(+1)", wsh_converter));
    BOOST_CHECK(!miniscript::FromString("thresh(-1,pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))", wsh_converter));
    BOOST_CHECK(!miniscript::FromString("multi(+1,03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204)", wsh_converter));

    // Timelock tests
    Test("after(100)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // only heightlock
    Test("after(1000000000)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // only timelock
    Test("or_b(l:after(100),al:after(1000000000))", "?", "?", TESTMODE_VALID); // or_b(timelock, heighlock) valid
    Test("and_b(after(100),a:after(1000000000))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TIMELOCKMIX); // and_b(timelock, heighlock) invalid
    /* This is correctly detected as non-malleable but for the wrong reason. The type system assumes that branches 1 and 2
       can be spent together to create a non-malleble witness, but because of mixing of timelocks they cannot be spent together.
       But since exactly one of the two after's can be satisfied, the witness involving the key cannot be malleated.
    */
    Test("thresh(2,ltv:after(1000000000),altv:after(100),a:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", "?", "?", TESTMODE_VALID | TESTMODE_TIMELOCKMIX | TESTMODE_NONMAL); // thresh with k = 2
    // This is actually non-malleable in practice, but we cannot detect it in type system. See above rationale
    Test("thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(1000000000),altv:after(100))", "?", "?", TESTMODE_VALID); // thresh with k = 1

    g_testdata.reset();
}